

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mark.hpp
# Opt level: O0

Mark * __thiscall
bm::Mark::add(Mark *this,uint64_t iterations,nanoseconds *total,nanoseconds *max,nanoseconds *min)

{
  bool bVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> *pdVar2;
  duration<long,_std::ratio<1L,_1000000000L>_> local_38;
  nanoseconds *local_30;
  nanoseconds *min_local;
  nanoseconds *max_local;
  nanoseconds *total_local;
  uint64_t iterations_local;
  Mark *this_local;
  
  local_30 = min;
  min_local = max;
  max_local = total;
  total_local = (nanoseconds *)iterations;
  iterations_local = (uint64_t)this;
  local_38.__r = (rep)std::chrono::operator+(&this->_total,total);
  bVar1 = std::chrono::operator<(&local_38,&this->_total);
  if (bVar1) {
    bVar1 = std::function::operator_cast_to_bool((function *)&this->_overflow_callback);
    if (bVar1) {
      std::function<void_(const_bm::Mark_&)>::operator()(&this->_overflow_callback,this);
    }
    (this->_total).__r = max_local->__r;
    this->_iterations = (uint64_t)total_local;
  }
  else {
    std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=(&this->_total,max_local);
    this->_iterations = (long)&total_local->__r + this->_iterations;
  }
  pdVar2 = std::max<std::chrono::duration<long,std::ratio<1l,1000000000l>>>(&this->_max,min_local);
  (this->_max).__r = pdVar2->__r;
  pdVar2 = std::min<std::chrono::duration<long,std::ratio<1l,1000000000l>>>(&this->_min,local_30);
  (this->_min).__r = pdVar2->__r;
  return this;
}

Assistant:

Mark& add(uint64_t iterations,
              const nanoseconds& total,
              const nanoseconds& max,
              const nanoseconds& min)
    {
        if (_total + total < _total)
        {
            if (_overflow_callback)
            {
                _overflow_callback(*this);
            }

            _total      = total;
            _iterations = iterations;
        }
        else
        {
            _total      += total;
            _iterations += iterations;
        }

        _max = (std::max)(_max, max);
        _min = (std::min)(_min, min);

        return *this;
    }